

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

String * __thiscall cm::String::insert(String *this,size_type index,size_type count,char ch)

{
  char *pcVar1;
  type pSVar2;
  undefined1 local_48 [8];
  string s;
  char ch_local;
  size_type count_local;
  size_type index_local;
  String *this_local;
  
  s.field_2._M_local_buf[0xf] = ch;
  std::__cxx11::string::string((string *)local_48);
  size(this);
  std::__cxx11::string::reserve((ulong)local_48);
  pcVar1 = data(this);
  size(this);
  std::__cxx11::string::assign(local_48,(ulong)pcVar1);
  std::__cxx11::string::insert((ulong)local_48,index,(char)count);
  pSVar2 = operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48);
  std::__cxx11::string::~string((string *)local_48);
  return pSVar2;
}

Assistant:

String& String::insert(size_type index, size_type count, char ch)
{
  std::string s;
  s.reserve(this->size() + count);
  s.assign(this->data(), this->size());
  s.insert(index, count, ch);
  return *this = std::move(s);
}